

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroup::updateCurrentTime(QSequentialAnimationGroup *this,int currentTime)

{
  long lVar1;
  bool bVar2;
  parameter_type pVar3;
  parameter_type pVar4;
  QSequentialAnimationGroupPrivate *newAnimationIndex_00;
  parameter_type pQVar5;
  AnimationIndex this_00;
  long lVar6;
  qsizetype qVar7;
  int in_ESI;
  QSequentialAnimationGroupPrivate *in_RDI;
  long in_FS_OFFSET;
  int in_stack_0000000c;
  int newCurrentTime;
  QSequentialAnimationGroupPrivate *d;
  AnimationIndex newAnimationIndex;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  QSequentialAnimationGroupPrivate *in_stack_ffffffffffffffc0;
  undefined1 intermediate;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  QSequentialAnimationGroupPrivate *newAnimationIndex_01;
  int iVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  newAnimationIndex_01 = in_RDI;
  newAnimationIndex_00 = d_func((QSequentialAnimationGroup *)0x68aabe);
  pQVar5 = QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                     ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                       *)0x68aad4);
  if (pQVar5 == (parameter_type)0x0) goto LAB_0068ad03;
  this_00 = QSequentialAnimationGroupPrivate::indexForCurrentTime(in_stack_ffffffffffffffc0);
  while( true ) {
    lVar6 = (long)this_00.index;
    qVar7 = QList<int>::size(&newAnimationIndex_00->actualDuration);
    if (qVar7 <= lVar6) break;
    QList<int>::removeLast
              ((QList<int> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  iVar8 = newAnimationIndex_00->lastLoop;
  pVar3 = ::QObjectCompatProperty::operator_cast_to_int
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                      *)0x68ab55);
  intermediate = (undefined1)((ulong)lVar6 >> 0x38);
  if ((iVar8 < pVar3) ||
     ((iVar8 = newAnimationIndex_00->lastLoop,
      pVar3 = ::QObjectCompatProperty::operator_cast_to_int
                        ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                          *)0x68ab7f), iVar8 == pVar3 &&
      (newAnimationIndex_00->currentAnimationIndex < this_00.index)))) {
    QSequentialAnimationGroupPrivate::advanceForwards
              ((QSequentialAnimationGroupPrivate *)this_00,(AnimationIndex *)newAnimationIndex_01);
    iVar8 = this_00.timeOffset;
  }
  else {
    in_stack_ffffffffffffffb4 = newAnimationIndex_00->lastLoop;
    pVar3 = ::QObjectCompatProperty::operator_cast_to_int
                      ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                        *)0x68abcb);
    if (pVar3 < in_stack_ffffffffffffffb4) {
LAB_0068ac10:
      QSequentialAnimationGroupPrivate::rewindForwards
                ((QSequentialAnimationGroupPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                 (AnimationIndex *)newAnimationIndex_00);
    }
    else {
      in_stack_ffffffffffffffb0 = newAnimationIndex_00->lastLoop;
      pVar3 = ::QObjectCompatProperty::operator_cast_to_int
                        ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                          *)0x68abf5);
      if ((in_stack_ffffffffffffffb0 == pVar3) &&
         (this_00.index < newAnimationIndex_00->currentAnimationIndex)) goto LAB_0068ac10;
    }
    iVar8 = this_00.timeOffset;
  }
  QSequentialAnimationGroupPrivate::setCurrentAnimation
            (in_RDI,(int)((ulong)newAnimationIndex_00 >> 0x20),(bool)intermediate);
  in_ESI = in_ESI - iVar8;
  pQVar5 = QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                     ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                       *)0x68ac4e);
  if (pQVar5 == (parameter_type)0x0) {
    (newAnimationIndex_00->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime
         = 0;
    QAbstractAnimation::stop
              ((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  else {
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                  *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    QAbstractAnimation::setCurrentTime((QAbstractAnimation *)newAnimationIndex_01,in_stack_0000000c)
    ;
    bVar2 = QSequentialAnimationGroupPrivate::atEnd
                      ((QSequentialAnimationGroupPrivate *)
                       CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
    if (bVar2) {
      QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                  *)0x68ac92);
      QAbstractAnimationPrivate::get((QAbstractAnimation *)0x68ac9a);
      pVar4 = ::QObjectCompatProperty::operator_cast_to_int
                        ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                          *)0x68aca9);
      (newAnimationIndex_00->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
      currentTime = (pVar4 - in_ESI) +
                    (newAnimationIndex_00->super_QAnimationGroupPrivate).
                    super_QAbstractAnimationPrivate.currentTime;
      QAbstractAnimation::stop
                ((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                );
    }
  }
  pVar3 = ::QObjectCompatProperty::operator_cast_to_int
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                      *)0x68acf6);
  newAnimationIndex_00->lastLoop = pVar3;
LAB_0068ad03:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSequentialAnimationGroup::updateCurrentTime(int currentTime)
{
    Q_D(QSequentialAnimationGroup);
    if (!d->currentAnimation)
        return;

    const QSequentialAnimationGroupPrivate::AnimationIndex newAnimationIndex = d->indexForCurrentTime();

    // remove unneeded animations from actualDuration list
    while (newAnimationIndex.index < d->actualDuration.size())
        d->actualDuration.removeLast();

    // newAnimationIndex.index is the new current animation
    if (d->lastLoop < d->currentLoop
        || (d->lastLoop == d->currentLoop && d->currentAnimationIndex < newAnimationIndex.index)) {
            // advancing with forward direction is the same as rewinding with backwards direction
            d->advanceForwards(newAnimationIndex);
    } else if (d->lastLoop > d->currentLoop
        || (d->lastLoop == d->currentLoop && d->currentAnimationIndex > newAnimationIndex.index)) {
            // rewinding with forward direction is the same as advancing with backwards direction
            d->rewindForwards(newAnimationIndex);
    }

    d->setCurrentAnimation(newAnimationIndex.index);

    const int newCurrentTime = currentTime - newAnimationIndex.timeOffset;

    if (d->currentAnimation) {
        d->currentAnimation->setCurrentTime(newCurrentTime);
        if (d->atEnd()) {
            //we make sure that we don't exceed the duration here
            d->currentTime += QAbstractAnimationPrivate::get(d->currentAnimation)->totalCurrentTime - newCurrentTime;
            stop();
        }
    } else {
        //the only case where currentAnimation could be null
        //is when all animations have been removed
        Q_ASSERT(d->animations.isEmpty());
        d->currentTime = 0;
        stop();
    }

    d->lastLoop = d->currentLoop;
}